

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_ratio_node0(REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio_node0)

{
  REF_DBL *pRVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  REF_DBL RVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  REF_DBL m [6];
  
  if ((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->max <= node1)) ||
     (((node1 < 0 || (ref_node->global[(uint)node0] < 0)) || (ref_node->global[(uint)node1] < 0))))
  {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x655,
           "ref_node_ratio_node0",3,"node invalid");
    return 3;
  }
  pRVar1 = ref_node->real;
  uVar2 = (ulong)(uint)(node1 * 0xf);
  uVar3 = (ulong)(uint)(node0 * 0xf);
  dVar11 = pRVar1[uVar2] - pRVar1[uVar3];
  dVar10 = pRVar1[uVar2 + 1] - pRVar1[uVar3 + 1];
  dVar9 = pRVar1[uVar2 + 2] - pRVar1[uVar3 + 2];
  auVar6._0_8_ = SQRT(dVar9 * dVar9 + dVar11 * dVar11 + dVar10 * dVar10) * 1e+20;
  auVar6._8_8_ = dVar11;
  auVar7._8_8_ = -dVar11;
  auVar7._0_8_ = -auVar6._0_8_;
  auVar7 = maxpd(auVar6,auVar7);
  dVar4 = auVar7._0_8_;
  if (auVar7._8_8_ < dVar4) {
    dVar8 = dVar10;
    if (dVar10 <= -dVar10) {
      dVar8 = -dVar10;
    }
    if (dVar8 < dVar4) {
      dVar8 = dVar9;
      if (dVar9 <= -dVar9) {
        dVar8 = -dVar9;
      }
      if (dVar8 < dVar4) {
        ref_node_metric_get(ref_node,node0,m);
        dVar4 = (m[5] * dVar9 + m[2] * dVar11 + dVar10 * m[4]) * dVar9 +
                (m[2] * dVar9 + m[0] * dVar11 + dVar10 * m[1]) * dVar11 +
                (m[4] * dVar9 + m[1] * dVar11 + m[3] * dVar10) * dVar10;
        if (dVar4 < 0.0) {
          RVar5 = sqrt(dVar4);
        }
        else {
          RVar5 = SQRT(dVar4);
        }
        *ratio_node0 = RVar5;
        return 0;
      }
    }
  }
  *ratio_node0 = 0.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_ratio_node0(REF_NODE ref_node, REF_INT node0,
                                        REF_INT node1, REF_DBL *ratio_node0) {
  REF_DBL direction[3], length;
  REF_DBL m[6];

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

  length = ref_math_dot(direction, direction);
  length = sqrt(length);

  if (!ref_math_divisible(direction[0], length) ||
      !ref_math_divisible(direction[1], length) ||
      !ref_math_divisible(direction[2], length)) {
    *ratio_node0 = 0.0;
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, node0, m), "node0 m");
  *ratio_node0 = ref_matrix_sqrt_vt_m_v(m, direction);

  return REF_SUCCESS;
}